

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VTKData.h
# Opt level: O2

void __thiscall
VTKUnstructuredGrid<MercuryParticle<2ul>>::write<MercuryTimeStep<2ul>>
          (VTKUnstructuredGrid<MercuryParticle<2ul>> *this,MercuryTimeStep<2UL> *container)

{
  ostream *poVar1;
  pointer pMVar2;
  long *plVar3;
  long *plVar4;
  ostream *poVar5;
  long *plVar6;
  MercuryParticle<2UL> *mem_1;
  pointer pMVar7;
  MercuryParticle<2UL> *mem;
  MercuryTimeStep<2UL> *__range2;
  string local_70 [32];
  string local_50 [32];
  
  poVar1 = (ostream *)(this + 8);
  poVar5 = std::operator<<(poVar1,
                           "<?xml version=\"1.0\"?>\n<VTKFile type=\"UnstructuredGrid\" version=\"0.1\" byte_order=\"LittleEndian\">\n <UnstructuredGrid>\n  <Piece NumberOfPoints=\""
                          );
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::operator<<(poVar5,
                  "\" NumberOfCells=\"0\">\n   <Cells>\n    <DataArray type=\"Int32\" name=\"connectivity\" format=\"ascii\">\n       0\n    </DataArray>\n    <DataArray type=\"Float32\" name=\"offset\" format=\"ascii\">\n       0\n    </DataArray>\n    <DataArray type=\"UInt8\" name=\"types\" format=\"ascii\">\n       1\n    </DataArray>\n   </Cells>\n   <Points>\n"
                 );
  plVar6 = *(long **)(*(long *)this + 0x18);
  poVar5 = std::operator<<(poVar1,"<DataArray type=\"");
  (**(code **)(*plVar6 + 0x18))(local_70,plVar6);
  poVar5 = std::operator<<(poVar5,local_70);
  poVar5 = std::operator<<(poVar5,"\" NumberOfComponents=\"");
  (**(code **)(*plVar6 + 0x20))(plVar6);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::operator<<(poVar5,"\" format=\"ascii\">\n");
  std::__cxx11::string::~string(local_70);
  pMVar2 = (container->storage_).
           super__Vector_base<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pMVar7 = (container->storage_).
                super__Vector_base<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_>.
                _M_impl.super__Vector_impl_data._M_start; pMVar7 != pMVar2; pMVar7 = pMVar7 + 1) {
    (**(code **)(*plVar6 + 0x10))(plVar6,poVar1,pMVar7);
  }
  std::operator<<(poVar1,"\n</DataArray>\n");
  std::operator<<(poVar1,"    </Points>\n    <PointData>\n");
  plVar3 = (long *)(*(undefined8 **)this)[1];
  for (plVar6 = (long *)**(undefined8 **)this; plVar6 != plVar3; plVar6 = plVar6 + 1) {
    plVar4 = (long *)*plVar6;
    poVar5 = std::operator<<(poVar1,"<DataArray type=\"");
    (**(code **)(*plVar4 + 0x18))(local_70,plVar4);
    poVar5 = std::operator<<(poVar5,local_70);
    poVar5 = std::operator<<(poVar5,"\" Name=\"");
    std::__cxx11::string::string(local_50,(string *)(plVar4 + 1));
    poVar5 = std::operator<<(poVar5,local_50);
    poVar5 = std::operator<<(poVar5,"\" NumberOfComponents=\"");
    (**(code **)(*plVar4 + 0x20))(plVar4);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::operator<<(poVar5,"\" format=\"ascii\">\n");
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string(local_70);
    pMVar2 = (container->storage_).
             super__Vector_base<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pMVar7 = (container->storage_).
                  super__Vector_base<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_>.
                  _M_impl.super__Vector_impl_data._M_start; pMVar7 != pMVar2; pMVar7 = pMVar7 + 1) {
      (**(code **)(*plVar4 + 0x10))(plVar4,poVar1,pMVar7);
    }
    std::operator<<(poVar1,"\n</DataArray>\n");
  }
  std::operator<<(poVar1,
                  "   </PointData>\n   <CellData/>\n  </Piece>\n </UnstructuredGrid>\n</VTKFile>\n")
  ;
  return;
}

Assistant:

void write(const C& container)
  {
    outFile_ <<
      "<?xml version=\"1.0\"?>\n"
       "<VTKFile type=\"UnstructuredGrid\" version=\"0.1\" byte_order=\"LittleEndian\">\n"
       " <UnstructuredGrid>\n"
       "  <Piece NumberOfPoints=\"" << container.size() << "\" NumberOfCells=\"0\">\n"
       "   <Cells>\n"
       "    <DataArray type=\"Int32\" name=\"connectivity\" format=\"ascii\">\n"
       "       0\n"
       "    </DataArray>\n"
       "    <DataArray type=\"Float32\" name=\"offset\" format=\"ascii\">\n"
       "       0\n"
       "    </DataArray>\n"
       "    <DataArray type=\"UInt8\" name=\"types\" format=\"ascii\">\n"
       "       1\n"
       "    </DataArray>\n"
       "   </Cells>\n"
       "   <Points>\n";
    Detail::VTKPointDescriptorEntry<T>* pDescr = descriptor_->positionEntry_;
    outFile_ << "<DataArray type=\"" << pDescr->getTypeName() << "\" "
                "NumberOfComponents=\"" << pDescr->getNumberOfComponents() << "\" "
                "format=\"ascii\">\n";
    for (const T& mem : container)
    {
      pDescr->emit(outFile_, mem);
    }
    outFile_ << "\n</DataArray>\n";
    
    outFile_ <<
      "    </Points>\n"
      "    <PointData>\n";
    
    for (Detail::VTKPointDescriptorEntry<T>* descr : descriptor_->entries_)
    {
      outFile_ << "<DataArray type=\""    << descr->getTypeName() << "\" "
                  "Name=\""               << descr->getName() << "\" "
                  "NumberOfComponents=\"" << descr->getNumberOfComponents() << "\" "
                  "format=\"ascii\">\n";
      for (const T& mem : container)
      {
        descr->emit(outFile_, mem);
      }
      outFile_ << "\n</DataArray>\n";
    }
    outFile_ <<
      "   </PointData>\n"
      "   <CellData/>\n"
      "  </Piece>\n"
      " </UnstructuredGrid>\n"
      "</VTKFile>\n";
  }